

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O3

void __thiscall TCLAP::CmdLine::_constructor(CmdLine *this)

{
  size_t *psVar1;
  CmdLineOutput *pCVar2;
  _List_node_base *p_Var3;
  Arg *pAVar4;
  _List_node_base *p_Var5;
  string local_90;
  string local_70;
  string local_50;
  
  pCVar2 = (CmdLineOutput *)operator_new(8);
  pCVar2->_vptr_CmdLineOutput = (_func_int **)&PTR__CmdLineOutput_00119ab0;
  this->_output = pCVar2;
  Arg::delimiterRef()::delim = this->_delimiter;
  if (this->_helpAndVersion == true) {
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3->_M_next = (_List_node_base *)&PTR__Visitor_00119b88;
    p_Var3->_M_prev = (_List_node_base *)this;
    p_Var3[1]._M_next = (_List_node_base *)&this->_output;
    pAVar4 = (Arg *)operator_new(0xa8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"h","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"help","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Displays usage information and exits.","");
    Arg::Arg(pAVar4,&local_50,&local_70,&local_90,false,false,(Visitor *)p_Var3);
    pAVar4->_vptr_Arg = (_func_int **)&PTR__Arg_00119a18;
    *(undefined2 *)&pAVar4->field_0xa3 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar4);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)pAVar4;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->_argDeleteOnExitList).
              super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->_visitorDeleteOnExitList).
              super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3->_M_next = (_List_node_base *)&PTR__Visitor_00119c28;
    p_Var3->_M_prev = (_List_node_base *)this;
    p_Var3[1]._M_next = (_List_node_base *)&this->_output;
    pAVar4 = (Arg *)operator_new(0xa8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"version","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Displays version information and exits.","");
    Arg::Arg(pAVar4,&local_50,&local_70,&local_90,false,false,(Visitor *)p_Var3);
    pAVar4->_vptr_Arg = (_func_int **)&PTR__Arg_00119a18;
    *(undefined2 *)&pAVar4->field_0xa3 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar4);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)pAVar4;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->_argDeleteOnExitList).
              super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->_visitorDeleteOnExitList).
              super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var3 = (_List_node_base *)operator_new(8);
  p_Var3->_M_next = (_List_node_base *)&PTR__Visitor_00119c68;
  pAVar4 = (Arg *)operator_new(0xa8);
  local_50.field_2._M_allocated_capacity._0_2_ = 0x2d;
  local_50._M_string_length = 1;
  local_70.field_2._M_allocated_capacity._0_7_ = 0x5f65726f6e6769;
  local_70.field_2._7_4_ = 0x74736572;
  local_70._M_string_length = 0xb;
  local_70.field_2._M_local_buf[0xb] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Ignores the rest of the labeled arguments following this flag.",""
            );
  Arg::Arg(pAVar4,&local_50,&local_70,&local_90,false,false,(Visitor *)p_Var3);
  pAVar4->_vptr_Arg = (_func_int **)&PTR__Arg_00119a18;
  *(undefined2 *)&pAVar4->field_0xa3 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar4);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)pAVar4;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->_argDeleteOnExitList).
            super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = p_Var3;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->_visitorDeleteOnExitList).
            super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

inline void CmdLine::_constructor()
{
	_output = new StdOutput;

	Arg::setDelimiter( _delimiter );

	Visitor* v;

	if ( _helpAndVersion )
	{
		v = new HelpVisitor( this, &_output );
		SwitchArg* help = new SwitchArg("h","help",
		                      "Displays usage information and exits.",
		                      false, v);
		add( help );
		deleteOnExit(help);
		deleteOnExit(v);

		v = new VersionVisitor( this, &_output );
		SwitchArg* vers = new SwitchArg("","version",
		                      "Displays version information and exits.",
		                      false, v);
		add( vers );
		deleteOnExit(vers);
		deleteOnExit(v);
	}

	v = new IgnoreRestVisitor();
	SwitchArg* ignore  = new SwitchArg(Arg::flagStartString(),
	          Arg::ignoreNameString(),
	          "Ignores the rest of the labeled arguments following this flag.",
	          false, v);
	add( ignore );
	deleteOnExit(ignore);
	deleteOnExit(v);
}